

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_consumer.c
# Opt level: O0

int amqp_basic_properties_clone
              (amqp_basic_properties_t *original,amqp_basic_properties_t *clone,amqp_pool_t *pool)

{
  int iVar1;
  amqp_pool_t *in_RDX;
  amqp_table_t *in_RSI;
  int *in_RDI;
  int res;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  memset(in_RSI,0,200);
  in_RSI->num_entries = *in_RDI;
  if ((in_RSI->num_entries & 0x8000U) != 0) {
    if (*(long *)(in_RDI + 2) == 0) {
      in_RSI->entries = (amqp_table_entry_t_ *)0;
      *(void **)(in_RSI + 1) = (void *)0x0;
    }
    else {
      amqp_pool_alloc_bytes
                (in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (amqp_bytes_t *)0x1174ad);
      if (*(long *)(in_RSI + 1) == 0) {
        return -1;
      }
      memcpy(*(void **)(in_RSI + 1),*(void **)(in_RDI + 4),(size_t)in_RSI->entries);
    }
  }
  if ((in_RSI->num_entries & 0x4000U) != 0) {
    if (*(long *)(in_RDI + 6) == 0) {
      in_RSI[1].entries = (amqp_table_entry_t_ *)0;
      *(void **)(in_RSI + 2) = (void *)0x0;
    }
    else {
      amqp_pool_alloc_bytes
                (in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (amqp_bytes_t *)0x117544);
      if (*(long *)(in_RSI + 2) == 0) {
        return -1;
      }
      memcpy(*(void **)(in_RSI + 2),*(void **)(in_RDI + 8),(size_t)in_RSI[1].entries);
    }
  }
  if ((in_RSI->num_entries & 0x2000U) != 0) {
    iVar1 = amqp_table_clone(in_RSI,(amqp_table_t *)in_RDX,
                             (amqp_pool_t *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (iVar1 != 0) {
      return iVar1;
    }
    in_stack_ffffffffffffffdc = 0;
  }
  if ((in_RSI->num_entries & 0x1000U) != 0) {
    *(char *)&in_RSI[3].entries = (char)in_RDI[0xe];
  }
  if ((in_RSI->num_entries & 0x800U) != 0) {
    *(undefined1 *)((long)&in_RSI[3].entries + 1) = *(undefined1 *)((long)in_RDI + 0x39);
  }
  if ((in_RSI->num_entries & 0x400U) != 0) {
    if (*(long *)(in_RDI + 0x10) == 0) {
      *(size_t *)(in_RSI + 4) = 0;
      in_RSI[4].entries = (amqp_table_entry_t_ *)(void *)0x0;
    }
    else {
      amqp_pool_alloc_bytes
                (in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (amqp_bytes_t *)0x117665);
      if (in_RSI[4].entries == (amqp_table_entry_t_ *)0x0) {
        return -1;
      }
      memcpy(in_RSI[4].entries,*(void **)(in_RDI + 0x12),*(size_t *)(in_RSI + 4));
    }
  }
  if ((in_RSI->num_entries & 0x200U) != 0) {
    if (*(long *)(in_RDI + 0x14) == 0) {
      *(size_t *)(in_RSI + 5) = 0;
      in_RSI[5].entries = (amqp_table_entry_t_ *)(void *)0x0;
    }
    else {
      amqp_pool_alloc_bytes
                (in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (amqp_bytes_t *)0x1176fc);
      if (in_RSI[5].entries == (amqp_table_entry_t_ *)0x0) {
        return -1;
      }
      memcpy(in_RSI[5].entries,*(void **)(in_RDI + 0x16),*(size_t *)(in_RSI + 5));
    }
  }
  if ((in_RSI->num_entries & 0x100U) != 0) {
    if (*(long *)(in_RDI + 0x18) == 0) {
      *(size_t *)(in_RSI + 6) = 0;
      in_RSI[6].entries = (amqp_table_entry_t_ *)(void *)0x0;
    }
    else {
      amqp_pool_alloc_bytes
                (in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (amqp_bytes_t *)0x117793);
      if (in_RSI[6].entries == (amqp_table_entry_t_ *)0x0) {
        return -1;
      }
      memcpy(in_RSI[6].entries,*(void **)(in_RDI + 0x1a),*(size_t *)(in_RSI + 6));
    }
  }
  if ((in_RSI->num_entries & 0x80U) != 0) {
    if (*(long *)(in_RDI + 0x1c) == 0) {
      *(size_t *)(in_RSI + 7) = 0;
      in_RSI[7].entries = (amqp_table_entry_t_ *)(void *)0x0;
    }
    else {
      amqp_pool_alloc_bytes
                (in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (amqp_bytes_t *)0x11782a);
      if (in_RSI[7].entries == (amqp_table_entry_t_ *)0x0) {
        return -1;
      }
      memcpy(in_RSI[7].entries,*(void **)(in_RDI + 0x1e),*(size_t *)(in_RSI + 7));
    }
  }
  if ((in_RSI->num_entries & 0x40U) != 0) {
    iVar1 = in_RDI[0x21];
    in_RSI[8].num_entries = in_RDI[0x20];
    *(int *)&in_RSI[8].field_0x4 = iVar1;
  }
  if ((in_RSI->num_entries & 0x20U) != 0) {
    if (*(long *)(in_RDI + 0x22) == 0) {
      in_RSI[8].entries = (amqp_table_entry_t_ *)0;
      *(void **)(in_RSI + 9) = (void *)0x0;
    }
    else {
      amqp_pool_alloc_bytes
                (in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (amqp_bytes_t *)0x1178f5);
      if (*(long *)(in_RSI + 9) == 0) {
        return -1;
      }
      memcpy(*(void **)(in_RSI + 9),*(void **)(in_RDI + 0x24),(size_t)in_RSI[8].entries);
    }
  }
  if ((in_RSI->num_entries & 0x10U) != 0) {
    if (*(long *)(in_RDI + 0x26) == 0) {
      in_RSI[9].entries = (amqp_table_entry_t_ *)0;
      *(void **)(in_RSI + 10) = (void *)0x0;
    }
    else {
      amqp_pool_alloc_bytes
                (in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (amqp_bytes_t *)0x1179a5);
      if (*(long *)(in_RSI + 10) == 0) {
        return -1;
      }
      memcpy(*(void **)(in_RSI + 10),*(void **)(in_RDI + 0x28),(size_t)in_RSI[9].entries);
    }
  }
  if ((in_RSI->num_entries & 8U) != 0) {
    if (*(long *)(in_RDI + 0x2a) == 0) {
      in_RSI[10].entries = (amqp_table_entry_t_ *)0;
      *(void **)(in_RSI + 0xb) = (void *)0x0;
    }
    else {
      amqp_pool_alloc_bytes
                (in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (amqp_bytes_t *)0x117a55);
      if (*(long *)(in_RSI + 0xb) == 0) {
        return -1;
      }
      memcpy(*(void **)(in_RSI + 0xb),*(void **)(in_RDI + 0x2c),(size_t)in_RSI[10].entries);
    }
  }
  if ((in_RSI->num_entries & 4U) != 0) {
    if (*(long *)(in_RDI + 0x2e) == 0) {
      in_RSI[0xb].entries = (amqp_table_entry_t_ *)0;
      *(void **)(in_RSI + 0xc) = (void *)0x0;
    }
    else {
      amqp_pool_alloc_bytes
                (in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (amqp_bytes_t *)0x117b05);
      if (*(long *)(in_RSI + 0xc) == 0) {
        return -1;
      }
      memcpy(*(void **)(in_RSI + 0xc),*(void **)(in_RDI + 0x30),(size_t)in_RSI[0xb].entries);
    }
  }
  return 0;
}

Assistant:

static
int amqp_basic_properties_clone(amqp_basic_properties_t *original,
                                amqp_basic_properties_t *clone,
                                amqp_pool_t *pool)
{
  memset(clone, 0, sizeof(amqp_basic_properties_t));
  clone->_flags = original->_flags;

#define CLONE_BYTES_POOL(original, clone, pool)         \
  if (0 == original.len) {                              \
    clone = amqp_empty_bytes;                           \
  } else {                                              \
    amqp_pool_alloc_bytes(pool, original.len, &clone);  \
    if (NULL == clone.bytes) {                          \
      return AMQP_STATUS_NO_MEMORY;                     \
    }                                                   \
    memcpy(clone.bytes, original.bytes, clone.len);     \
  }

  if (clone->_flags & AMQP_BASIC_CONTENT_TYPE_FLAG) {
    CLONE_BYTES_POOL(original->content_type, clone->content_type, pool)
  }

  if (clone->_flags & AMQP_BASIC_CONTENT_ENCODING_FLAG) {
    CLONE_BYTES_POOL(original->content_encoding, clone->content_encoding, pool)
  }

  if (clone->_flags & AMQP_BASIC_HEADERS_FLAG) {
    int res = amqp_table_clone(&original->headers, &clone->headers, pool);
    if (AMQP_STATUS_OK != res) {
      return res;
    }
  }

  if (clone->_flags & AMQP_BASIC_DELIVERY_MODE_FLAG) {
    clone->delivery_mode = original->delivery_mode;
  }

  if (clone->_flags & AMQP_BASIC_PRIORITY_FLAG) {
    clone->priority = original->priority;
  }

  if (clone->_flags & AMQP_BASIC_CORRELATION_ID_FLAG) {
    CLONE_BYTES_POOL(original->correlation_id, clone->correlation_id, pool)
  }

  if (clone->_flags & AMQP_BASIC_REPLY_TO_FLAG) {
    CLONE_BYTES_POOL(original->reply_to, clone->reply_to, pool)
  }

  if (clone->_flags & AMQP_BASIC_EXPIRATION_FLAG) {
    CLONE_BYTES_POOL(original->expiration, clone->expiration, pool)
  }

  if (clone->_flags & AMQP_BASIC_MESSAGE_ID_FLAG) {
    CLONE_BYTES_POOL(original->message_id, clone->message_id, pool)
  }

  if (clone->_flags & AMQP_BASIC_TIMESTAMP_FLAG) {
    clone->timestamp = original->timestamp;
  }

  if (clone->_flags & AMQP_BASIC_TYPE_FLAG) {
    CLONE_BYTES_POOL(original->type, clone->type, pool)
  }

  if (clone->_flags & AMQP_BASIC_USER_ID_FLAG) {
    CLONE_BYTES_POOL(original->user_id, clone->user_id, pool)
  }

  if (clone->_flags & AMQP_BASIC_APP_ID_FLAG) {
    CLONE_BYTES_POOL(original->app_id, clone->app_id, pool)
  }

  if (clone->_flags & AMQP_BASIC_CLUSTER_ID_FLAG) {
    CLONE_BYTES_POOL(original->cluster_id, clone->cluster_id, pool)
  }

  return AMQP_STATUS_OK;
#undef CLONE_BYTES_POOL
}